

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O2

void __thiscall
TEST_TestHarness_c_checkLongLongIntText_Test::TEST_TestHarness_c_checkLongLongIntText_Test
          (TEST_TestHarness_c_checkLongLongIntText_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture = (TestTestingFixture *)0x0;
  TEST_GROUP_CppUTestGroupTestHarness_c::TEST_GROUP_CppUTestGroupTestHarness_c
            (&this->super_TEST_GROUP_CppUTestGroupTestHarness_c);
  (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_00382a18;
  return;
}

Assistant:

TEST(TestHarness_c, checkLongLongIntText)
{
    CHECK_EQUAL_C_LONGLONG_TEXT(2, 2, "Text");
    fixture->setTestFunction(failLongLongIntTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: LongLongTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}